

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O2

CFastSet<int> * __thiscall CFastSet<int>::operator=(CFastSet<int> *this,CFastSet<int> *set)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (this != set) {
    iVar3 = this->elementsSize;
    piVar2 = this->elements;
    if (iVar3 != set->elementsSize) {
      iVar3 = set->elementsSize;
      if (piVar2 != (int *)0x0) {
        operator_delete__(piVar2);
        iVar3 = set->elementsSize;
      }
      this->elementsSize = iVar3;
      uVar5 = 0xffffffffffffffff;
      if (-1 < iVar3) {
        uVar5 = (long)iVar3 * 4;
      }
      piVar2 = (int *)operator_new__(uVar5);
      this->elements = piVar2;
    }
    piVar1 = set->elements;
    for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      piVar2[lVar4] = piVar1[lVar4];
      iVar3 = this->elementsSize;
    }
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=( const CFastSet& set )
{
	if( this != &set ) {
		if( elementsSize != set.elementsSize ) {
			delete[] elements;
			elementsSize = set.elementsSize;
			elements = new T[elementsSize];
		}
		for( int i = 0; i < elementsSize; i++ ) {
			elements[i] = set.elements[i];
		}
	}
	return *this;
}